

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_internal.h
# Opt level: O3

ParseDescriptorResponseStruct * __thiscall
cfd::js::api::
ExecuteStructApi<cfd::js::api::ParseDescriptorRequestStruct,cfd::js::api::ParseDescriptorResponseStruct>
          (ParseDescriptorResponseStruct *__return_storage_ptr__,api *this,
          ParseDescriptorRequestStruct *request,
          function<cfd::js::api::ParseDescriptorResponseStruct_(const_cfd::js::api::ParseDescriptorRequestStruct_&)>
          *call_function,string *fuction_name)

{
  CfdException *cfde;
  long *plVar1;
  undefined1 auVar2 [12];
  anon_enum_32 local_1fc;
  CfdException local_1f8;
  undefined1 local_1c8 [416];
  
  ParseDescriptorResponseStruct::ParseDescriptorResponseStruct(__return_storage_ptr__);
  cfd::Initialize();
  if ((request->descriptor)._M_string_length == 0) {
    auVar2 = std::__throw_bad_function_call();
    if (auVar2._8_4_ == 3) {
      cfde = (CfdException *)__cxa_begin_catch(auVar2._0_8_);
      local_1c8._0_8_ = "cfdjs_internal.h";
      local_1c8._8_4_ = 0x32;
      local_1c8._16_8_ = "ExecuteStructApi";
      local_1fc = (**(code **)(*(long *)cfde + 0x18))(cfde);
      local_1f8._0_8_ = (**(code **)(*(long *)cfde + 0x10))(cfde);
      core::logger::log<std::__cxx11::string&,cfd::core::CfdError&,char_const*&>
                ((CfdSourceLocation *)local_1c8,kCfdLogLevelWarning,
                 "Failed to {}. CfdException occurred:  code={}, message={}",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)call_function,
                 &local_1fc,(char **)&local_1f8);
      ConvertCfdExceptionToStruct((InnerErrorResponseStruct *)local_1c8,cfde);
      InnerErrorResponseStruct::operator=
                (&__return_storage_ptr__->error,(InnerErrorResponseStruct *)local_1c8);
      InnerErrorResponseStruct::~InnerErrorResponseStruct((InnerErrorResponseStruct *)local_1c8);
      __cxa_end_catch();
    }
    else {
      plVar1 = (long *)__cxa_begin_catch(auVar2._0_8_);
      if (auVar2._8_4_ == 2) {
        local_1c8._0_8_ = "cfdjs_internal.h";
        local_1c8._8_4_ = 0x38;
        local_1c8._16_8_ = "ExecuteStructApi";
        local_1f8._0_8_ = (**(code **)(*plVar1 + 0x10))(plVar1);
        core::logger::log<std::__cxx11::string&,char_const*&>
                  ((CfdSourceLocation *)local_1c8,kCfdLogLevelWarning,
                   "Failed to {}. Exception occurred: message={}",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   call_function,(char **)&local_1f8);
        core::CfdException::CfdException(&local_1f8);
        ConvertCfdExceptionToStruct((InnerErrorResponseStruct *)local_1c8,&local_1f8);
        InnerErrorResponseStruct::operator=
                  (&__return_storage_ptr__->error,(InnerErrorResponseStruct *)local_1c8);
        InnerErrorResponseStruct::~InnerErrorResponseStruct((InnerErrorResponseStruct *)local_1c8);
        core::CfdException::~CfdException(&local_1f8);
        __cxa_end_catch();
      }
      else {
        local_1c8._0_8_ = "cfdjs_internal.h";
        local_1c8._8_4_ = 0x3d;
        local_1c8._16_8_ = "ExecuteStructApi";
        core::logger::log<std::__cxx11::string&>
                  ((CfdSourceLocation *)local_1c8,kCfdLogLevelWarning,
                   "Failed to {}. Unknown exception occurred.",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   call_function);
        core::CfdException::CfdException(&local_1f8);
        ConvertCfdExceptionToStruct((InnerErrorResponseStruct *)local_1c8,&local_1f8);
        InnerErrorResponseStruct::operator=
                  (&__return_storage_ptr__->error,(InnerErrorResponseStruct *)local_1c8);
        InnerErrorResponseStruct::~InnerErrorResponseStruct((InnerErrorResponseStruct *)local_1c8);
        core::CfdException::~CfdException(&local_1f8);
        __cxa_end_catch();
      }
    }
  }
  else {
    (*(code *)(request->descriptor).field_2._M_allocated_capacity)(local_1c8,request,this);
    ParseDescriptorResponseStruct::operator=
              (__return_storage_ptr__,(ParseDescriptorResponseStruct *)local_1c8);
    ParseDescriptorResponseStruct::~ParseDescriptorResponseStruct
              ((ParseDescriptorResponseStruct *)local_1c8);
  }
  return __return_storage_ptr__;
}

Assistant:

ResponseStructType ExecuteStructApi(
    const RequestStructType& request,
    std::function<ResponseStructType(const RequestStructType&)> call_function,
    std::string fuction_name) {
  ResponseStructType response;
  try {
    cfd::Initialize();

    response = call_function(request);
  } catch (const CfdException& cfde) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to {}. CfdException occurred:  code={}, message={}",
        fuction_name, cfde.GetErrorCode(), cfde.what());
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(cfde);
  } catch (const std::exception& except) {
    warn(
        CFD_LOG_SOURCE, "Failed to {}. Exception occurred: message={}",
        fuction_name, except.what());
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(CfdException());
  } catch (...) {
    warn(
        CFD_LOG_SOURCE, "Failed to {}. Unknown exception occurred.",
        fuction_name);
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(CfdException());
  }
  return response;
}